

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Player.cpp
# Opt level: O0

void __thiscall Player::die(Player *this)

{
  int iVar1;
  int iVar2;
  undefined8 uVar3;
  void *pvVar4;
  void *pvVar5;
  Player *in_RDI;
  undefined8 uVar6;
  undefined8 in_XMM1_Qa;
  ALLEGRO_FONT *small_font;
  ALLEGRO_FONT *large_font;
  ResourceManager *rm;
  int h;
  int w;
  ALLEGRO_BITMAP *old_target;
  int in_stack_ffffffffffffff8c;
  ResourceManager *in_stack_ffffffffffffff90;
  
  shake();
  reset(in_RDI);
  in_RDI->lives = in_RDI->lives + -1;
  if (in_RDI->lives < 1) {
    (in_RDI->super_Entity).isDestructable = false;
    in_RDI->invincibleCount = 8000;
    uVar3 = al_get_target_bitmap();
    al_set_target_bitmap(in_RDI->highscoreBitmap);
    iVar1 = al_get_bitmap_width(in_RDI->highscoreBitmap);
    iVar2 = al_get_bitmap_height(in_RDI->highscoreBitmap);
    ResourceManager::getInstance();
    pvVar4 = ResourceManager::getData(in_stack_ffffffffffffff90,in_stack_ffffffffffffff8c);
    pvVar5 = ResourceManager::getData(in_stack_ffffffffffffff90,in_stack_ffffffffffffff8c);
    uVar6 = al_map_rgb(0xff,0xff);
    al_draw_textf(uVar6,in_XMM1_Qa,(float)(iVar1 / 2),(float)(iVar2 / 2 + -0x10),pvVar4,1,
                  "GAME OVER");
    uVar6 = al_map_rgb(0xff,0xff);
    al_draw_textf(uVar6,in_XMM1_Qa,(float)(iVar1 / 2),(float)(iVar2 / 2 + 0x10),pvVar5,1,"%d Points"
                  ,in_RDI->score);
    al_set_target_bitmap(uVar3);
  }
  else {
    (in_RDI->super_Entity).hp = 1;
    (in_RDI->super_Entity).isDestructable = false;
    in_RDI->invincibleCount = 3000;
  }
  return;
}

Assistant:

void Player::die(void)
{
   shake();
   reset();

   lives--;
   if (lives <= 0) {
      // game over
      isDestructable = false;
      invincibleCount = 8000;
      ALLEGRO_BITMAP *old_target = al_get_target_bitmap();
      al_set_target_bitmap(highscoreBitmap);
      int w = al_get_bitmap_width(highscoreBitmap);
      int h = al_get_bitmap_height(highscoreBitmap);
      ResourceManager& rm = ResourceManager::getInstance();
      ALLEGRO_FONT *large_font = (ALLEGRO_FONT *)rm.getData(RES_LARGEFONT);
      ALLEGRO_FONT *small_font = (ALLEGRO_FONT *)rm.getData(RES_SMALLFONT);
      al_draw_textf(large_font, al_map_rgb(255, 255, 255), w/2, h/2-16, ALLEGRO_ALIGN_CENTRE, "GAME OVER");
      al_draw_textf(small_font, al_map_rgb(255, 255, 255), w/2, h/2+16, ALLEGRO_ALIGN_CENTRE, "%d Points", score);
      al_set_target_bitmap(old_target);
   }
   else {
      hp = 1;
      isDestructable = false;
      invincibleCount = 3000;
   }
}